

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

Node * prvTidyGetToken(TidyDocImpl *doc,GetTokenMode mode)

{
  uint *puVar1;
  int *piVar2;
  char *pcVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  char cVar12;
  TidyTagId TVar13;
  Lexer *lexer;
  Lexer *pLVar14;
  Dict *pDVar15;
  ctmbstr s1;
  TidyAllocator *allocator;
  NodeType type;
  tmbchar tVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  Bool BVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  Node *pNVar24;
  ulong uVar25;
  tmbstr ptVar26;
  AttVal *pAVar27;
  Attribute *pAVar28;
  tmbstr ptVar29;
  ctmbstr ptVar30;
  Node *pNVar31;
  StreamIn *pSVar32;
  ulong uVar33;
  long lVar34;
  uint uVar35;
  bool bVar36;
  uint local_88;
  int local_80;
  Bool isempty;
  ulong local_78;
  Node *local_70;
  AttVal *local_68;
  undefined4 local_5c;
  undefined8 local_58;
  Node *asp;
  undefined8 local_48;
  Node *php;
  int delim;
  
  lexer = doc->lexer;
  pNVar24 = lexer->itoken;
  if (lexer->pushed != no) {
    if (pNVar24 != (Node *)0x0) {
      lexer->pushed = no;
      return pNVar24;
    }
LAB_00140203:
    lexer->pushed = no;
    pNVar24 = lexer->token;
    if ((pNVar24->type == TextNode) &&
       ((lexer->insert != (IStack *)0x0 || (lexer->inode != (Node *)0x0)))) {
      pNVar24 = prvTidyInsertedToken(doc);
      lexer->itoken = pNVar24;
    }
    return pNVar24;
  }
  if (pNVar24 != (Node *)0x0) {
    lexer->itoken = (Node *)0x0;
    goto LAB_00140203;
  }
  if (((lexer->insert != (IStack *)0x0) || (lexer->inode != (Node *)0x0)) &&
     (lexer->istacksize != 0)) {
    pNVar24 = prvTidyInsertedToken(doc);
    goto LAB_00140255;
  }
  if (mode == CdataContent) {
    pNVar24 = lexer->parent;
    if (pNVar24 == (Node *)0x0) {
      __assert_fail("lexer->parent != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/htacg[P]tidy-html5/src/lexer.c"
                    ,0x9bf,"Node *prvTidyGetToken(TidyDocImpl *, GetTokenMode)");
    }
    local_58 = prvTidyAttrGetById(pNVar24,TidyAttr_SRC);
    if ((pNVar24->tag == (Dict *)0x0) ||
       ((TVar13 = pNVar24->tag->id, TVar13 != TidyTag_STYLE && (TVar13 != TidyTag_SCRIPT)))) {
      local_78 = 0;
    }
    else {
      local_78 = (ulong)CONCAT31((int3)(TVar13 >> 8),*(int *)((doc->config).value + 0x4f) != 0);
    }
    pSVar32 = doc->docIn;
    uVar4 = pSVar32->curcol;
    uVar8 = pSVar32->curline;
    lexer->lines = uVar8;
    lexer->columns = uVar4;
    lexer->waswhite = no;
    lexer->txtend = lexer->lexsize;
    lexer->txtstart = lexer->lexsize;
    local_80 = 0;
    iVar19 = 0;
    bVar36 = true;
    uVar33 = 0;
    do {
      uVar17 = prvTidyReadChar(pSVar32);
      if (uVar17 == 0xffffffff) goto LAB_001411be;
      prvTidyAddCharToLexer(lexer,uVar17);
      lexer->txtend = lexer->lexsize;
      uVar21 = (uint)uVar33;
      if (iVar19 == 1) {
        if ((uVar17 < 0x80) && ((lexmap[uVar17] & 2) != 0)) {
LAB_00140628:
          iVar19 = 1;
        }
        else {
          ptVar30 = pNVar24->element;
          ptVar26 = lexer->lexbuf;
          uVar17 = prvTidytmbstrlen(ptVar30);
          iVar19 = prvTidytmbstrncasecmp(ptVar30,ptVar26 + uVar33,uVar17);
          local_80 = local_80 + (uint)(((byte)local_78 ^ 1) & iVar19 == 0);
LAB_001405e3:
          iVar19 = 0;
        }
      }
      else if (iVar19 == 0) {
        if (uVar17 == 0x3c) {
          uVar17 = prvTidyReadChar(doc->docIn);
          if ((uVar17 < 0x80) && ((lexmap[uVar17] & 2) != 0)) {
            if (((bVar36 && local_58 != (AttVal *)0x0) && (pNVar24->tag != (Dict *)0x0)) &&
               (pNVar24->tag->id == TidyTag_SCRIPT)) {
              lexer->lexsize = lexer->txtstart;
              prvTidyUngetChar(uVar17,doc->docIn);
              prvTidyUngetChar(0x3c,doc->docIn);
              return (Node *)0x0;
            }
            prvTidyAddCharToLexer(lexer,uVar17);
            uVar33 = (ulong)(lexer->lexsize - 1);
            goto LAB_00140628;
          }
          if (uVar17 == 0x5c) {
            prvTidyAddCharToLexer(lexer,0x5c);
            uVar17 = prvTidyReadChar(doc->docIn);
            if (uVar17 == 0x2f) {
              prvTidyAddCharToLexer(lexer,0x2f);
              iVar19 = 0;
              if ((char)local_78 == '\0') {
                uVar17 = prvTidyReadChar(doc->docIn);
                if ((uVar17 < 0x80) && ((lexmap[uVar17] & 2) != 0)) goto LAB_001403d6;
                prvTidyUngetChar(uVar17,doc->docIn);
                iVar19 = 0;
              }
              goto LAB_0014062c;
            }
          }
          else if (uVar17 == 0x2f) {
            prvTidyAddCharToLexer(lexer,0x2f);
            uVar17 = prvTidyReadChar(doc->docIn);
            if ((uVar17 < 0x80) && ((lexmap[uVar17] & 2) != 0)) {
LAB_001403d6:
              prvTidyUngetChar(uVar17,doc->docIn);
              uVar33 = (ulong)lexer->lexsize;
              goto LAB_00140565;
            }
          }
          prvTidyUngetChar(uVar17,doc->docIn);
          goto LAB_001405e3;
        }
        iVar19 = 0;
        if (((bVar36) && (uVar17 < 0x80)) && ((lexmap[uVar17] & 8) != 0)) {
          bVar36 = true;
        }
        else {
          bVar36 = false;
        }
      }
      else if ((uVar17 < 0x80) && ((lexmap[uVar17] & 2) != 0)) {
LAB_00140565:
        iVar19 = 2;
      }
      else {
        ptVar30 = pNVar24->element;
        ptVar26 = lexer->lexbuf;
        uVar18 = prvTidytmbstrlen(ptVar30);
        iVar19 = prvTidytmbstrncasecmp(ptVar30,ptVar26 + uVar33,uVar18);
        if ((bVar36) && (iVar19 != 0)) {
          uVar18 = lexer->lexsize;
          while (uVar18 = uVar18 - 1, uVar21 <= uVar18) {
            prvTidyUngetChar((int)lexer->lexbuf[uVar18],doc->docIn);
          }
          prvTidyUngetChar(0x2f,doc->docIn);
          prvTidyUngetChar(0x3c,doc->docIn);
LAB_001411be:
          if (bVar36) {
            lexer->txtstart = lexer->txtend;
            lexer->lexsize = lexer->txtend;
          }
          else {
            lexer->txtend = lexer->lexsize;
          }
          if (uVar17 == 0xffffffff) {
            prvTidyReport(doc,pNVar24,(Node *)0x0,0x25a);
          }
          pNVar24 = prvTidyTextToken(lexer);
          return pNVar24;
        }
        if (iVar19 == 0) {
          if (local_80 < 1) {
            uVar18 = lexer->lexsize;
            while (uVar18 = uVar18 - 1, uVar21 <= uVar18) {
              prvTidyUngetChar((int)lexer->lexbuf[uVar18],doc->docIn);
            }
            prvTidyUngetChar(0x2f,doc->docIn);
            prvTidyUngetChar(0x3c,doc->docIn);
            lexer->lexsize = uVar21 - 2;
            goto LAB_001411be;
          }
          local_80 = local_80 + -1;
        }
        iVar19 = 0;
        if (lexer->lexbuf[uVar21 - 2] != '\\') {
          pSVar32 = doc->docIn;
          lexer->lines = pSVar32->curline;
          lexer->columns = pSVar32->curcol - 3;
          BVar20 = prvTidyIsJavaScript(pNVar24);
          if (((BVar20 != no) && (*(int *)((doc->config).value + 0x1a) != 0)) &&
             (BVar20 = prvTidyIsHTML5Mode(doc), BVar20 == no)) {
            prvTidyReport(doc,(Node *)0x0,(Node *)0x0,0x22c);
            uVar25 = (ulong)lexer->lexsize;
            while (ptVar26 = lexer->lexbuf, uVar21 - 1 < uVar25) {
              ptVar26[uVar25] = ptVar26[uVar25 - 1 & 0xffffffff];
              uVar25 = uVar25 - 1;
            }
            ptVar26[uVar21 - 1] = '\\';
            lexer->lexsize = lexer->lexsize + 1;
          }
        }
      }
LAB_0014062c:
      pSVar32 = doc->docIn;
    } while( true );
  }
  isempty = no;
  local_68 = (AttVal *)0x0;
  iVar19 = *(int *)((doc->config).value + 0x1c);
  if (iVar19 == 1) {
    bVar36 = true;
  }
  else if (iVar19 == 0) {
    bVar36 = false;
  }
  else {
    uVar21 = prvTidyHTMLVersion(doc);
    bVar36 = (uVar21 >> 0x11 & 1) == 0;
  }
  lexer->token = (Node *)0x0;
  pSVar32 = doc->docIn;
  uVar5 = pSVar32->curcol;
  uVar9 = pSVar32->curline;
  lexer->lines = uVar9;
  lexer->columns = uVar5;
  lexer->waswhite = no;
  lexer->txtend = lexer->lexsize;
  lexer->txtstart = lexer->lexsize;
  local_88 = 0xffffffff;
  iVar19 = 0;
LAB_00140698:
  uVar21 = prvTidyReadChar(pSVar32);
  if (uVar21 == 0xffffffff) goto LAB_00141057;
  if (lexer->insertspace != no) {
    prvTidyAddCharToLexer(lexer,0x20);
    lexer->waswhite = yes;
    lexer->insertspace = no;
  }
  if (mode == Preformatted && uVar21 == 0xa0) {
    uVar21 = 0x20;
  }
  prvTidyAddCharToLexer(lexer,uVar21);
  switch(lexer->state) {
  case LEX_CONTENT:
    if (uVar21 < 0x80) {
      if (((mode == IgnoreWhitespace & (byte)lexmap[uVar21] >> 3) == 1) &&
         (lexer->lexsize == lexer->txtstart + 1)) {
        lexer->lexsize = lexer->lexsize - 1;
        lexer->waswhite = no;
        uVar6 = doc->docIn->curcol;
        uVar10 = doc->docIn->curline;
        lexer->lines = uVar10;
        lexer->columns = uVar6;
LAB_0014075e:
        mode = IgnoreWhitespace;
      }
      else if (uVar21 == 0x3c) {
        lexer->state = LEX_GT;
      }
      else {
        if ((lexmap[uVar21] & 8) == 0) {
          if (mode != IgnoreMarkup && uVar21 == 0x26) {
            ParseEntity(doc,mode);
          }
          goto LAB_00140d58;
        }
        if (lexer->waswhite == no) {
          lexer->waswhite = yes;
          if (((mode - OtherNamespace < 0xfffffffe) && (uVar21 != 0x20)) && (lexer->lexsize != 0)) {
            lexer->lexbuf[lexer->lexsize - 1] = ' ';
          }
        }
        else if (mode - OtherNamespace < 0xfffffffe) {
          lexer->lexsize = lexer->lexsize - 1;
          uVar7 = doc->docIn->curcol;
          uVar11 = doc->docIn->curline;
          lexer->lines = uVar11;
          lexer->columns = uVar7;
        }
      }
    }
    else {
LAB_00140d58:
      mode = mode + (mode == IgnoreWhitespace);
LAB_00140d60:
      lexer->waswhite = no;
    }
    break;
  case LEX_GT:
    if (uVar21 == 0x2f) {
      uVar17 = prvTidyReadChar(doc->docIn);
      if (uVar17 == 0xffffffff) {
        prvTidyUngetChar(0xffffffff,doc->docIn);
      }
      else {
        prvTidyAddCharToLexer(lexer,uVar17);
        if (((uVar17 < 0x80) && ((lexmap[uVar17] & 2) != 0)) ||
           ((*(int *)((doc->config).value + 0x67) != 0 &&
            (BVar20 = prvTidyIsXMLNamechar(uVar17), BVar20 != no)))) {
          uVar18 = lexer->lexsize - 3;
          lexer->lexsize = uVar18;
          lexer->txtend = uVar18;
          prvTidyUngetChar(uVar17,doc->docIn);
          lexer->state = LEX_ENDTAG;
          lexer->lexbuf[lexer->lexsize] = '\0';
          piVar2 = &doc->docIn->curcol;
          *piVar2 = *piVar2 + -2;
          if (lexer->txtstart < lexer->txtend) {
            if (mode == IgnoreWhitespace) goto LAB_00141085;
            goto LAB_0014109a;
          }
        }
        else {
          lexer->waswhite = no;
          lexer->state = LEX_CONTENT;
        }
      }
    }
    else if (mode == IgnoreMarkup) {
      lexer->waswhite = no;
      lexer->state = LEX_CONTENT;
      mode = IgnoreMarkup;
    }
    else {
      if (uVar21 == 0x3f) {
        uVar21 = lexer->lexsize - 2;
        lexer->lexsize = uVar21;
        lexer->state = LEX_PROCINSTR;
      }
      else if (uVar21 == 0x23) {
        uVar21 = lexer->lexsize - 2;
        lexer->lexsize = uVar21;
        lexer->state = LEX_JSTE;
      }
      else if (uVar21 == 0x25) {
        uVar21 = lexer->lexsize - 2;
        lexer->lexsize = uVar21;
        lexer->state = LEX_ASP;
      }
      else {
        if (uVar21 != 0x21) {
          if (((0x7f < uVar21) || ((lexmap[uVar21] & 2) == 0)) &&
             ((*(int *)((doc->config).value + 0x67) == 0 ||
              (BVar20 = prvTidyIsXMLNamechar(uVar21), BVar20 == no)))) {
            prvTidyUngetChar(uVar21,doc->docIn);
            lexer->lexsize = lexer->lexsize - 1;
            lexer->state = LEX_CONTENT;
            goto LAB_00140d60;
          }
          prvTidyUngetChar(uVar21,doc->docIn);
          prvTidyUngetChar(0x3c,doc->docIn);
          uVar21 = lexer->lexsize - 2;
          lexer->lexsize = uVar21;
          lexer->txtend = uVar21;
          lexer->state = LEX_STARTTAG;
          if (uVar21 <= lexer->txtstart) break;
          goto LAB_0014109a;
        }
        uVar17 = prvTidyReadChar(doc->docIn);
        if (uVar17 == 0x2d) {
          uVar17 = prvTidyReadChar(doc->docIn);
          if (uVar17 != 0x2d) {
LAB_00140ff4:
            prvTidyReport(doc,(Node *)0x0,(Node *)0x0,0x250);
            do {
              uVar17 = prvTidyReadChar(doc->docIn);
              if (uVar17 == 0x3e) goto LAB_0014102c;
            } while (uVar17 != 0xffffffff);
            prvTidyUngetChar(0xffffffff,doc->docIn);
LAB_0014102c:
            uVar21 = lexer->lexsize - 2;
            lexer->lexsize = uVar21;
            lexer->lexbuf[uVar21] = '\0';
            lexer->state = LEX_CONTENT;
            break;
          }
          lexer->state = LEX_COMMENT;
          uVar21 = lexer->lexsize - 2;
          lexer->lexsize = uVar21;
        }
        else {
          if ((uVar17 & 0xffffffdf) == 0x44) {
            lexer->state = LEX_DOCTYPE;
            uVar17 = lexer->lexsize - 2;
            lexer->lexsize = uVar17;
            lexer->txtend = uVar17;
            do {
              uVar17 = prvTidyReadChar(doc->docIn);
              if ((uVar17 == 0xffffffff) || (uVar17 == 0x3e)) goto LAB_00140f9a;
            } while ((0x7f < uVar17) || ((lexmap[uVar17] & 8) == 0));
            do {
              uVar17 = prvTidyReadChar(doc->docIn);
              if (((uVar17 == 0xffffffff) || (uVar17 == 0x3e)) || (0x7f < uVar17)) break;
            } while ((lexmap[uVar17] & 8) != 0);
LAB_00140f9a:
            prvTidyUngetChar(uVar17,doc->docIn);
            if (lexer->txtend <= lexer->txtstart) {
              lexer->txtstart = lexer->lexsize;
              goto LAB_0014075e;
            }
            goto LAB_0014109a;
          }
          if (uVar17 != 0x5b) goto LAB_00140ff4;
          uVar21 = lexer->lexsize - 2;
          lexer->lexsize = uVar21;
          lexer->state = LEX_SECTION;
        }
      }
      lexer->txtend = uVar21;
      if (lexer->txtstart < uVar21) goto LAB_0014109a;
      lexer->txtstart = uVar21;
    }
    break;
  case LEX_ENDTAG:
    lexer->txtstart = lexer->lexsize - 1;
    piVar2 = &doc->docIn->curcol;
    *piVar2 = *piVar2 + 2;
    tVar16 = ParseTagName(doc);
    pNVar24 = TagToken(doc,EndTag);
    lexer->token = pNVar24;
    lexer->txtend = lexer->txtstart;
    lexer->lexsize = lexer->txtstart;
    uVar17 = (uint)tVar16;
    while (uVar17 != 0xffffffff) {
      if (uVar17 == 0x3e) {
        lexer->state = LEX_CONTENT;
        lexer->waswhite = no;
        goto LAB_0014104e;
      }
      uVar17 = prvTidyReadChar(doc->docIn);
    }
    prvTidyFreeNode(doc,lexer->token);
    break;
  case LEX_STARTTAG:
    uVar17 = prvTidyReadChar(doc->docIn);
    if (lexer->lexsize != 0) {
      lexer->lexbuf[lexer->lexsize - 1] = (tmbchar)uVar17;
      local_88 = lexer->lexsize - 1;
    }
    lexer->txtstart = local_88;
    tVar16 = ParseTagName(doc);
    isempty = no;
    pNVar24 = TagToken(doc,StartTag);
    lexer->token = pNVar24;
    if (tVar16 == '>') {
      pNVar31 = (Node *)0x0;
      goto LAB_00141a5f;
    }
    if (tVar16 == '/') {
      prvTidyUngetChar(0x2f,doc->docIn);
    }
    pLVar14 = doc->lexer;
    asp = (Node *)0x0;
    goto LAB_0014128a;
  case LEX_COMMENT:
    if (uVar21 == 0x2d) {
      uVar17 = prvTidyReadChar(doc->docIn);
      if (((uVar17 != 0x2d & bVar36) == 1) && (lexer->lexsize - lexer->txtstart == 1)) {
        lexer->lexbuf[lexer->lexsize - 1] = '=';
      }
      prvTidyAddCharToLexer(lexer,uVar17);
      if (uVar17 == 0x2d) {
        do {
          iVar19 = iVar19 + 1;
          uVar17 = prvTidyReadChar(doc->docIn);
          if (uVar17 == 0x3e) {
            if (iVar19 != 1) {
              uVar21 = prvTidyHTMLVersion(doc);
              if ((uVar21 >> 0x11 & 1) == 0) {
                uVar17 = (uint)(bVar36 ^ 1U) + (uint)(bVar36 ^ 1U) * 2 + 0x24f;
              }
              else {
                uVar17 = 0x24f;
                if (bVar36 == false) goto LAB_00141876;
              }
              prvTidyReport(doc,(Node *)0x0,(Node *)0x0,uVar17);
            }
LAB_00141876:
            uVar21 = lexer->lexsize - 2;
            lexer->lexsize = uVar21;
            lexer->txtend = uVar21;
            lexer->lexbuf[uVar21] = '\0';
            lexer->state = LEX_CONTENT;
            lexer->waswhite = no;
            pNVar24 = NewToken(doc,CommentTag);
            lexer->token = pNVar24;
            uVar17 = prvTidyReadChar(doc->docIn);
            if (uVar17 == 10) {
              pNVar24 = lexer->token;
              pNVar24->linebreak = yes;
              return pNVar24;
            }
            prvTidyUngetChar(uVar17,doc->docIn);
            goto LAB_0014104e;
          }
          if (iVar19 == 1) {
            pSVar32 = doc->docIn;
            lexer->lines = pSVar32->curline;
            lexer->columns = pSVar32->curcol - 3;
          }
          if (bVar36 == false) {
            if (uVar17 != 0x2d) goto LAB_00140e26;
          }
          else {
            lexer->lexbuf[lexer->lexsize - 2] = '=';
            if (uVar17 != 0x2d) goto LAB_00140e19;
          }
          prvTidyAddCharToLexer(lexer,0x2d);
        } while( true );
      }
    }
    break;
  case LEX_DOCTYPE:
    prvTidyUngetChar(uVar21,doc->docIn);
    lexer->lexsize = lexer->lexsize - 1;
    pLVar14 = doc->lexer;
    local_78 = CONCAT44(local_78._4_4_,pLVar14->lexsize);
    local_70 = prvTidyNewNode(pLVar14->allocator,pLVar14);
    local_70->type = DocTypeTag;
    uVar17 = pLVar14->txtend;
    local_70->start = pLVar14->txtstart;
    local_70->end = uVar17;
    pLVar14->waswhite = no;
    local_58 = (AttVal *)((ulong)local_58._4_4_ << 0x20);
    local_5c = 1;
    iVar19 = 1;
    while (uVar17 = prvTidyReadChar(doc->docIn), uVar17 != 0xffffffff) {
      uVar21 = 0x20;
      if (uVar17 != 10) {
        uVar21 = uVar17;
      }
      uVar35 = uVar17;
      if (iVar19 != 4) {
        uVar35 = uVar21;
      }
      BVar20 = no;
      uVar23 = uVar35;
      if ((((0x7f < uVar35) || (iVar19 == 4)) || (BVar20 = no, (lexmap[uVar35] & 8) == 0)) ||
         (BVar20 = yes, uVar23 = uVar21, pLVar14->waswhite == no)) {
        prvTidyAddCharToLexer(pLVar14,uVar23);
        pLVar14->waswhite = BVar20;
        if (((uVar35 < 0x80) && ((lexmap[uVar21] & 8) != 0)) ||
           ((uVar17 == 0x5b || (iVar19 = 1, uVar17 == 0x3e)))) {
          ptVar26 = prvTidytmbstrndup(doc->allocator,pLVar14->lexbuf + (int)(uint)local_78,
                                      ~(uint)local_78 + pLVar14->lexsize);
          local_70->element = ptVar26;
          if ((uVar17 == 0x5b) || (iVar19 = 0, uVar17 == 0x3e)) {
            pLVar14->lexsize = pLVar14->lexsize - 1;
            prvTidyUngetChar(uVar17,doc->docIn);
            iVar19 = 0;
          }
        }
      }
    }
    prvTidyReport(doc,(Node *)0x0,(Node *)0x0,0x253);
    prvTidyFreeNode(doc,local_70);
    lexer->token = (Node *)0x0;
    lexer->txtend = lexer->lexsize;
    lexer->lexbuf[lexer->lexsize] = '\0';
    lexer->state = LEX_CONTENT;
    lexer->waswhite = no;
    if (((lexer->doctype == 0) && (pNVar24 = lexer->token, pNVar24 != (Node *)0x0)) &&
       (*(int *)((doc->config).value + 0x67) == 0)) {
      pAVar27 = prvTidyGetAttrByName(pNVar24,"PUBLIC");
      if ((pAVar27 == (AttVal *)0x0) || (ptVar30 = pAVar27->value, ptVar30 == (ctmbstr)0x0)) {
        if ((pNVar24->element != (ctmbstr)0x0) &&
           (iVar19 = prvTidytmbstrcasecmp(pNVar24->element,"html"), iVar19 == 0)) {
          lexer->doctype = 0x60000;
          goto LAB_0014104e;
        }
        lexer->doctype = 0;
      }
      else {
        for (lVar34 = 0x18; lVar34 != 0x310; lVar34 = lVar34 + 0x28) {
          s1 = *(ctmbstr *)((long)&W3C_Doctypes[0].score + lVar34);
          if ((s1 != (ctmbstr)0x0) && (iVar19 = prvTidytmbstrcasecmp(s1,ptVar30), iVar19 == 0)) {
            uVar21 = *(uint *)((long)&entities[0x7ef].code + lVar34);
            if ((uVar21 & 0x41f00) != 0) {
              prvTidySetOptionBool(doc,TidyXmlOut,yes);
              prvTidySetOptionBool(doc,TidyXhtmlOut,yes);
              doc->lexer->isvoyager = yes;
            }
            goto LAB_00141e0e;
          }
        }
        uVar21 = 0;
LAB_00141e0e:
        (*doc->allocator->vtbl->free)(doc->allocator,pAVar27->value);
        allocator = doc->allocator;
        ptVar30 = GetFPIFromVers(uVar21);
        ptVar26 = prvTidytmbstrdup(allocator,ptVar30);
        pAVar27->value = ptVar26;
        lexer->doctype = uVar21;
        if (uVar21 == 0x60000) goto LAB_0014104e;
      }
      prvTidyAdjustTags(doc);
    }
LAB_0014104e:
    return lexer->token;
  case LEX_PROCINSTR:
    uVar33 = (ulong)lexer->txtstart;
    uVar17 = lexer->lexsize;
    if (uVar17 - lexer->txtstart == 3) {
      iVar22 = prvTidytmbstrncmp(lexer->lexbuf + uVar33,"php",3);
      if (iVar22 == 0) {
        lexer->state = LEX_PHP;
        break;
      }
      uVar33 = (ulong)lexer->txtstart;
      uVar17 = lexer->lexsize;
    }
    if (((uVar17 - (int)uVar33 == 4) &&
        (iVar22 = prvTidytmbstrncmp(lexer->lexbuf + uVar33,"xml",3), iVar22 == 0)) &&
       ((-1 < (long)lexer->lexbuf[lexer->txtstart + 3] &&
        ((lexmap[lexer->lexbuf[lexer->txtstart + 3]] & 8) != 0)))) {
      lexer->state = LEX_XMLDECL;
      local_68 = (AttVal *)0x0;
    }
    else {
      if ((*(int *)((doc->config).value + 0x65) != 0) || (lexer->isvoyager != no)) {
        if (uVar21 != 0x3f) break;
        uVar21 = prvTidyReadChar(doc->docIn);
        if (uVar21 == 0xffffffff) {
          prvTidyReport(doc,(Node *)0x0,(Node *)0x0,0x284);
          pSVar32 = doc->docIn;
          uVar17 = 0xffffffff;
          goto LAB_00140c45;
        }
        prvTidyAddCharToLexer(lexer,uVar21);
      }
      if (uVar21 == 0x3e) {
        uVar17 = lexer->lexsize;
        uVar21 = uVar17 - 1;
        lexer->lexsize = uVar21;
        if (uVar21 == 0) {
          lexer->txtend = 0;
          *lexer->lexbuf = '\0';
          pNVar24 = NewToken(doc,ProcInsTag);
          lexer->token = pNVar24;
          goto LAB_00141c9c;
        }
        uVar18 = lexer->txtstart;
        ptVar26 = lexer->lexbuf;
        uVar33 = 0;
        goto LAB_00141af1;
      }
    }
    break;
  case LEX_CDATA:
    if (uVar21 != 0x5d) break;
    uVar17 = prvTidyReadChar(doc->docIn);
    pSVar32 = doc->docIn;
    if (uVar17 == 0x5d) {
      uVar17 = prvTidyReadChar(pSVar32);
      if (uVar17 != 0x3e) {
        prvTidyUngetChar(uVar17,doc->docIn);
        pSVar32 = doc->docIn;
        uVar17 = 0x5d;
        goto LAB_00140c45;
      }
      uVar21 = lexer->lexsize - 1;
      lexer->lexsize = uVar21;
      lexer->txtend = uVar21;
      lexer->lexbuf[uVar21] = '\0';
      lexer->state = LEX_CONTENT;
      lexer->waswhite = no;
      type = CDATATag;
      goto LAB_00141133;
    }
    goto LAB_00140c45;
  case LEX_SECTION:
    if (uVar21 == 0x3e) {
      prvTidyUngetChar(0x3e,doc->docIn);
    }
    else if (uVar21 != 0x5d) {
      if (((uVar21 == 0x5b) && (lexer->lexsize == lexer->txtstart + 6)) &&
         (iVar22 = prvTidytmbstrncmp(lexer->lexbuf + lexer->txtstart,"CDATA[",6), iVar22 == 0)) {
        lexer->state = LEX_CDATA;
        lexer->lexsize = lexer->lexsize - 6;
      }
      break;
    }
    uVar17 = prvTidyReadChar(doc->docIn);
    if (uVar17 == 0x2d) {
      uVar17 = prvTidyReadChar(doc->docIn);
      if (uVar17 == 0x2d) {
        uVar17 = prvTidyReadChar(doc->docIn);
        if (uVar17 == 0x3e) goto LAB_00141a13;
        prvTidyUngetChar(uVar17,doc->docIn);
        uVar17 = 0x2d;
        prvTidyUngetChar(0x2d,doc->docIn);
        pSVar32 = doc->docIn;
      }
      else {
        prvTidyUngetChar(uVar17,doc->docIn);
        pSVar32 = doc->docIn;
        uVar17 = 0x2d;
      }
      goto LAB_00140c45;
    }
    if (uVar17 != 0x3e) goto LAB_00140c3c;
LAB_00141a13:
    uVar21 = lexer->lexsize - 1;
    lexer->lexsize = uVar21;
    lexer->txtend = uVar21;
    lexer->lexbuf[uVar21] = '\0';
    lexer->state = LEX_CONTENT;
    lexer->waswhite = no;
    type = SectionTag;
    goto LAB_00141133;
  case LEX_ASP:
    if (uVar21 == 0x25) {
      uVar17 = prvTidyReadChar(doc->docIn);
      if (uVar17 != 0x3e) goto LAB_00140c3c;
      uVar21 = lexer->lexsize - 1;
      lexer->lexsize = uVar21;
      lexer->txtend = uVar21;
      lexer->lexbuf[uVar21] = '\0';
      lexer->state = LEX_CONTENT;
      lexer->waswhite = no;
      type = AspTag;
      goto LAB_00141133;
    }
    break;
  case LEX_JSTE:
    if (uVar21 == 0x23) {
      uVar17 = prvTidyReadChar(doc->docIn);
      if (uVar17 != 0x3e) goto LAB_00140c3c;
      uVar21 = lexer->lexsize - 1;
      lexer->lexsize = uVar21;
      lexer->txtend = uVar21;
      lexer->lexbuf[uVar21] = '\0';
      lexer->state = LEX_CONTENT;
      lexer->waswhite = no;
      type = JsteTag;
      goto LAB_00141133;
    }
    break;
  case LEX_PHP:
    if (uVar21 == 0x3f) {
      uVar17 = prvTidyReadChar(doc->docIn);
      if (uVar17 != 0x3e) goto LAB_00140c3c;
      uVar21 = lexer->lexsize - 1;
      lexer->lexsize = uVar21;
      lexer->txtend = uVar21;
      lexer->lexbuf[uVar21] = '\0';
      lexer->state = LEX_CONTENT;
      lexer->waswhite = no;
      type = PhpTag;
      goto LAB_00141133;
    }
    break;
  case LEX_XMLDECL:
    if (uVar21 < 0x80) {
      if ((uVar21 != 0x3f) && ((lexmap[uVar21] & 8) != 0)) break;
      if (uVar21 != 0x3f) goto LAB_00140b0d;
    }
    else {
LAB_00140b0d:
      local_48._0_4_ = 0;
      isempty = no;
      prvTidyUngetChar(uVar21,doc->docIn);
      ptVar26 = ParseAttribute(doc,&isempty,&asp,&php);
      if (ptVar26 == (tmbstr)0x0) {
        if (asp != (Node *)0x0) {
          pAVar27 = (AttVal *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x38);
          pAVar27->asp = (Node *)0x0;
          pAVar27->php = (Node *)0x0;
          pAVar27->next = (AttVal *)0x0;
          pAVar27->dict = (Attribute *)0x0;
          pAVar27->delim = 0;
          *(undefined4 *)&pAVar27->field_0x24 = 0;
          pAVar27->attribute = (tmbstr)0x0;
          pAVar27->value = (tmbstr)0x0;
          pAVar27->asp = asp;
          AddAttrToList(&local_68,pAVar27);
        }
        if (php != (Node *)0x0) {
          pAVar27 = (AttVal *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x38);
          pAVar27->asp = (Node *)0x0;
          pAVar27->php = (Node *)0x0;
          pAVar27->next = (AttVal *)0x0;
          pAVar27->dict = (Attribute *)0x0;
          pAVar27->delim = 0;
          *(undefined4 *)&pAVar27->field_0x24 = 0;
          pAVar27->attribute = (tmbstr)0x0;
          pAVar27->value = (tmbstr)0x0;
          pAVar27->php = php;
          AddAttrToList(&local_68,pAVar27);
        }
        goto LAB_00141977;
      }
      pAVar27 = (AttVal *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x38);
      pAVar27->delim = 0;
      *(undefined4 *)&pAVar27->field_0x24 = 0;
      pAVar27->attribute = (tmbstr)0x0;
      pAVar27->next = (AttVal *)0x0;
      pAVar27->dict = (Attribute *)0x0;
      pAVar27->asp = (Node *)0x0;
      pAVar27->php = (Node *)0x0;
      pAVar27->value = (tmbstr)0x0;
      pAVar27->attribute = ptVar26;
      ptVar26 = ParseValue(doc,ptVar26,yes,&isempty,(int *)&local_48);
      pAVar27->value = ptVar26;
      pAVar27->delim = (int)local_48;
      pAVar28 = prvTidyFindAttribute(doc,pAVar27);
      pAVar27->dict = pAVar28;
      AddAttrToList(&local_68,pAVar27);
    }
    uVar17 = prvTidyReadChar(doc->docIn);
    if (uVar17 == 0x3e) {
LAB_00141977:
      lexer->lexsize = lexer->lexsize - 1;
      lexer->txtend = lexer->txtstart;
      lexer->lexbuf[lexer->txtstart] = '\0';
      lexer->state = LEX_CONTENT;
      lexer->waswhite = no;
      pNVar24 = NewToken(doc,XmlDecl);
      lexer->token = pNVar24;
      pNVar24->attributes = local_68;
      return pNVar24;
    }
LAB_00140c3c:
    pSVar32 = doc->docIn;
LAB_00140c45:
    prvTidyUngetChar(uVar17,pSVar32);
  }
switchD_00140701_default:
  pSVar32 = doc->docIn;
  goto LAB_00140698;
LAB_00141af1:
  uVar35 = uVar21 - uVar18;
  if (uVar21 - uVar18 == uVar33) {
LAB_00141c3e:
    uVar23 = uVar17 - 2;
    uVar33 = (ulong)uVar23;
    cVar12 = ptVar26[uVar33];
    if (cVar12 == '?') {
      lexer->lexsize = uVar23;
      uVar21 = uVar23;
    }
    else {
      uVar33 = (ulong)uVar21;
    }
    lexer->txtstart = uVar18 + uVar35;
    lexer->txtend = uVar21;
    ptVar26[uVar33] = '\0';
    pNVar24 = NewToken(doc,ProcInsTag);
    lexer->token = pNVar24;
    pNVar24->closed = (uint)(cVar12 == '?');
    ptVar26 = prvTidytmbstrndup(doc->allocator,
                                lexer->lexbuf + ((ulong)lexer->txtstart - (ulong)uVar35),uVar35);
    pNVar24 = lexer->token;
    pNVar24->element = ptVar26;
LAB_00141c9c:
    lexer->state = LEX_CONTENT;
    lexer->waswhite = no;
    return pNVar24;
  }
  uVar35 = (uint)uVar33;
  if ((-1 < (long)ptVar26[uVar18 + uVar35]) && ((lexmap[ptVar26[uVar18 + uVar35]] & 8) != 0))
  goto LAB_00141c3e;
  uVar33 = uVar33 + 1;
  goto LAB_00141af1;
LAB_00140e19:
  lexer->lexbuf[lexer->lexsize - 1] = '=';
LAB_00140e26:
  prvTidyAddCharToLexer(lexer,uVar17);
  goto switchD_00140701_default;
LAB_0014128a:
  pSVar32 = doc->docIn;
  if (pSVar32 == (StreamIn *)0x0) {
    __assert_fail("doc->docIn != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/htacg[P]tidy-html5/src/lexer.c"
                  ,0x386,"Bool EndOfInput(TidyDocImpl *)");
  }
  if ((pSVar32->pushed == no) && (BVar20 = prvTidyIsEOF(pSVar32), BVar20 != no)) {
LAB_001418d5:
    pNVar24 = lexer->token;
    pNVar31 = asp;
    if (isempty != no) {
      pNVar24->type = StartEndTag;
    }
LAB_00141a5f:
    pNVar24->attributes = (AttVal *)pNVar31;
    lexer->txtend = lexer->txtstart;
    lexer->lexsize = lexer->txtstart;
    pDVar15 = pNVar24->tag;
    if (pDVar15 == (Dict *)0x0) {
      BVar20 = no;
      if (mode == Preformatted) {
        mode = Preformatted;
      }
      else if (pNVar24->type == StartTag) goto LAB_00141b40;
    }
    else {
      TVar13 = pDVar15->id;
      if (TVar13 == TidyTag_PRE || mode == Preformatted) {
        mode = Preformatted;
LAB_00141ab6:
        if ((TVar13 != TidyTag_HR) && (BVar20 = no, TVar13 != TidyTag_BR)) goto LAB_00141b7a;
      }
      else if ((pNVar24->type != StartTag) || ((pDVar15->model & 1) != 0)) goto LAB_00141ab6;
LAB_00141b40:
      uVar17 = prvTidyReadChar(doc->docIn);
      if ((mode != IgnoreWhitespace && uVar17 == 10) ||
         ((BVar20 = yes, uVar17 != 10 && (uVar17 != 0xc)))) {
        prvTidyUngetChar(uVar17,doc->docIn);
        BVar20 = yes;
      }
    }
LAB_00141b7a:
    lexer->waswhite = BVar20;
    lexer->state = LEX_CONTENT;
    pNVar24 = lexer->token;
    if (pNVar24->tag != (Dict *)0x0) {
      bVar36 = *(int *)((doc->config).value + 0x67) == 0;
      if (bVar36) {
        puVar1 = &doc->lexer->versions;
        *puVar1 = *puVar1 & (pNVar24->tag->versions | 0xe000);
      }
      prvTidyRepairDuplicateAttributes(doc,pNVar24,(uint)!bVar36);
      goto LAB_0014104e;
    }
    if (mode == OtherNamespace) goto LAB_0014104e;
    if ((doc->lexer->doctype & 0x60000) == 0) {
LAB_00141c06:
      uVar17 = 0x28c;
    }
    else {
      BVar20 = prvTidyelementIsAutonomousCustomFormat(pNVar24->element);
      pNVar24 = lexer->token;
      if (BVar20 == no) goto LAB_00141c06;
      uVar17 = 0x28b;
    }
    prvTidyReport(doc,(Node *)0x0,pNVar24,uVar17);
    goto LAB_0014104e;
  }
  ptVar26 = ParseAttribute(doc,&isempty,&php,(Node **)&local_48);
  pNVar24 = php;
  if (ptVar26 == (tmbstr)0x0) {
    if (php == (Node *)0x0) {
      pNVar24 = (Node *)CONCAT44(local_48._4_4_,(int)local_48);
      if (pNVar24 == (Node *)0x0) goto LAB_001418d5;
      pAVar27 = (AttVal *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x38);
      pAVar27->asp = (Node *)0x0;
      pAVar27->php = (Node *)0x0;
      pAVar27->next = (AttVal *)0x0;
      pAVar27->dict = (Attribute *)0x0;
      pAVar27->delim = 0;
      *(undefined4 *)&pAVar27->field_0x24 = 0;
      pAVar27->attribute = (tmbstr)0x0;
      pAVar27->value = (tmbstr)0x0;
      pAVar27->php = pNVar24;
    }
    else {
      pAVar27 = (AttVal *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x38);
      pAVar27->asp = (Node *)0x0;
      pAVar27->php = (Node *)0x0;
      pAVar27->next = (AttVal *)0x0;
      pAVar27->dict = (Attribute *)0x0;
      pAVar27->delim = 0;
      *(undefined4 *)&pAVar27->field_0x24 = 0;
      pAVar27->attribute = (tmbstr)0x0;
      pAVar27->value = (tmbstr)0x0;
      pAVar27->asp = pNVar24;
    }
    AddAttrToList((AttVal **)&asp,pAVar27);
  }
  else {
    ptVar29 = ParseValue(doc,ptVar26,no,&isempty,&delim);
    if ((-1 < (long)*ptVar26) && ((lexmap[*ptVar26] & 2) != 0)) {
      uVar33 = 1;
      do {
        uVar17 = prvTidytmbstrlen(ptVar26);
        if (uVar17 <= uVar33) goto LAB_0014134a;
        pcVar3 = ptVar26 + uVar33;
      } while ((-1 < (long)*pcVar3) && (uVar33 = uVar33 + 1, (lexmap[*pcVar3] & 4) != 0));
    }
    if ((*(int *)((doc->config).value + 0x67) == 0) ||
       (BVar20 = prvTidyIsValidXMLID(ptVar26), BVar20 == no)) {
      pAVar27 = (AttVal *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x38);
      pAVar27->next = (AttVal *)0x0;
      pAVar27->dict = (Attribute *)0x0;
      pAVar27->asp = (Node *)0x0;
      pAVar27->php = (Node *)0x0;
      *(undefined8 *)&pAVar27->delim = 0;
      pAVar27->attribute = ptVar26;
      pAVar27->value = ptVar29;
      if ((*ptVar26 == '\0') ||
         (uVar17 = prvTidytmbstrlen(ptVar26), ptVar26[(long)(int)uVar17 + -1] != '\"')) {
        pNVar24 = pLVar14->token;
        if (ptVar29 == (tmbstr)0x0) {
          uVar17 = 0x256;
        }
        else {
          uVar17 = 0x248;
        }
      }
      else {
        pNVar24 = pLVar14->token;
        uVar17 = 0x25d;
      }
      prvTidyReportAttrError(doc,pNVar24,pAVar27,uVar17);
      prvTidyFreeAttribute(doc,pAVar27);
    }
    else {
LAB_0014134a:
      pAVar27 = (AttVal *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x38);
      pAVar27->next = (AttVal *)0x0;
      pAVar27->dict = (Attribute *)0x0;
      pAVar27->asp = (Node *)0x0;
      pAVar27->php = (Node *)0x0;
      *(undefined8 *)&pAVar27->delim = 0;
      bVar36 = delim == 0;
      iVar19 = delim;
      if (bVar36) {
        iVar19 = 0x22;
      }
      pAVar27->delim = iVar19;
      pAVar27->attribute = ptVar26;
      pAVar27->value = ptVar29;
      pAVar28 = prvTidyFindAttribute(doc,pAVar27);
      pAVar27->dict = pAVar28;
      AddAttrToList((AttVal **)&asp,pAVar27);
      if (ptVar29 != (tmbstr)0x0 && bVar36) {
        prvTidyReportAttrError(doc,pLVar14->token,pAVar27,0x25e);
      }
    }
  }
  goto LAB_0014128a;
LAB_00141057:
  if (lexer->state == LEX_COMMENT) {
    prvTidyReport(doc,(Node *)0x0,(Node *)0x0,0x251);
    lexer->txtend = lexer->lexsize;
    lexer->lexbuf[lexer->lexsize] = '\0';
    lexer->state = LEX_CONTENT;
    lexer->waswhite = no;
    type = CommentTag;
LAB_00141133:
    pNVar24 = NewToken(doc,type);
  }
  else {
    if ((lexer->state != LEX_CONTENT) ||
       (lexer->txtend = lexer->lexsize, lexer->lexsize <= lexer->txtstart)) {
      if (local_68 != (AttVal *)0x0) {
        prvTidyFreeAttribute(doc,local_68);
      }
      return (Node *)0x0;
    }
    prvTidyUngetChar(0xffffffff,doc->docIn);
LAB_00141085:
    uVar21 = lexer->lexsize - 1;
    if (lexer->lexbuf[uVar21] == ' ') {
      lexer->lexsize = uVar21;
      lexer->txtend = uVar21;
    }
LAB_0014109a:
    pNVar24 = prvTidyTextToken(lexer);
  }
LAB_00140255:
  lexer->token = pNVar24;
  return pNVar24;
}

Assistant:

Node* TY_(GetToken)( TidyDocImpl* doc, GetTokenMode mode )
{
    Node *node;
    Lexer* lexer = doc->lexer;

    if (lexer->pushed || lexer->itoken)
    {
        /* Deal with previously returned duplicate inline token */
        if (lexer->itoken)
        {
            /* itoken rejected */
            if (lexer->pushed)
            {
                lexer->pushed = no;
                node = lexer->itoken;
                GTDBG(doc,"lex-itoken", node);
                return node;
            }
            /* itoken has been accepted */
            lexer->itoken = NULL;
        }
            
        /* duplicate inlines in preference to pushed text nodes when appropriate */
        lexer->pushed = no;
        if (lexer->token->type != TextNode
            || !(lexer->insert || lexer->inode)) {
            node = lexer->token;
            GTDBG(doc,"lex-token", node);
            return node;
        }
        lexer->itoken = TY_(InsertedToken)( doc );
        node = lexer->itoken;
        GTDBG(doc,"lex-inserted", node);
        return node;
    }

    assert( !(lexer->pushed || lexer->itoken) );

    /* at start of block elements, unclosed inline
       elements are inserted into the token stream 
       Issue #341 - Can NOT insert a token if NO istacksize  
     */
    if ((lexer->insert || lexer->inode) && lexer->istacksize)
    {
        /*\ Issue #92: could fix by the following, but instead chose not to stack these 2
         *  if ( !(lexer->insert && (nodeIsINS(lexer->insert) || nodeIsDEL(lexer->insert))) ) {
        \*/
        lexer->token = TY_(InsertedToken)( doc );
        node = lexer->token;
        GTDBG(doc,"lex-inserted2", node);
        return node;
    }

    if (mode == CdataContent)
    {
        assert( lexer->parent != NULL );
        node = GetCDATA(doc, lexer->parent);
        GTDBG(doc,"lex-cdata", node);
        return node;
    }

    return GetTokenFromStream( doc, mode );
}